

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::QuadMvIntersectorKMoeller<4,_4,_false>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  Ref<embree::Geometry> *pRVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined4 uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  undefined1 (*pauVar32) [16];
  long lVar33;
  Geometry *pGVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  undefined1 (*pauVar40) [16];
  undefined1 (*pauVar41) [16];
  long lVar42;
  ulong unaff_R13;
  size_t mask;
  long lVar43;
  undefined1 (*pauVar44) [16];
  int iVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  uint uVar53;
  undefined1 auVar54 [16];
  uint uVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  float fVar61;
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [64];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  float fVar77;
  undefined1 auVar78 [32];
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar79 [64];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  vbool<8> valid;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  ulong local_27f8;
  ulong local_27f0;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined1 local_2760 [32];
  undefined1 local_2740 [8];
  float fStack_2738;
  float fStack_2734;
  float fStack_2730;
  float fStack_272c;
  float fStack_2728;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  float local_2600;
  float fStack_25fc;
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  float local_25e0;
  float fStack_25dc;
  float fStack_25d8;
  float fStack_25d4;
  float fStack_25d0;
  float fStack_25cc;
  float fStack_25c8;
  float fStack_25c4;
  float local_25c0;
  float fStack_25bc;
  float fStack_25b8;
  float fStack_25b4;
  float fStack_25b0;
  float fStack_25ac;
  float fStack_25a8;
  float fStack_25a4;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  undefined4 uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  undefined4 uStack_23e4;
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  pauVar41 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  fVar58 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_2640._4_4_ = fVar58;
  local_2640._0_4_ = fVar58;
  local_2640._8_4_ = fVar58;
  local_2640._12_4_ = fVar58;
  local_2640._16_4_ = fVar58;
  local_2640._20_4_ = fVar58;
  local_2640._24_4_ = fVar58;
  local_2640._28_4_ = fVar58;
  auVar70 = ZEXT3264(local_2640);
  fVar59 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_2660._4_4_ = fVar59;
  local_2660._0_4_ = fVar59;
  local_2660._8_4_ = fVar59;
  local_2660._12_4_ = fVar59;
  local_2660._16_4_ = fVar59;
  local_2660._20_4_ = fVar59;
  local_2660._24_4_ = fVar59;
  local_2660._28_4_ = fVar59;
  auVar71 = ZEXT3264(local_2660);
  fVar60 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_2680._4_4_ = fVar60;
  local_2680._0_4_ = fVar60;
  local_2680._8_4_ = fVar60;
  local_2680._12_4_ = fVar60;
  local_2680._16_4_ = fVar60;
  local_2680._20_4_ = fVar60;
  local_2680._24_4_ = fVar60;
  local_2680._28_4_ = fVar60;
  auVar74 = ZEXT3264(local_2680);
  fVar58 = fVar58 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar59 = fVar59 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar60 = fVar60 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar37 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar38 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar39 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar45 = (tray->tfar).field_0.i[k];
  auVar87 = ZEXT3264(CONCAT428(iVar45,CONCAT424(iVar45,CONCAT420(iVar45,CONCAT416(iVar45,CONCAT412(
                                                  iVar45,CONCAT48(iVar45,CONCAT44(iVar45,iVar45)))))
                                               )));
  local_2620._8_4_ = 0x80000000;
  local_2620._0_8_ = 0x8000000080000000;
  local_2620._12_4_ = 0x80000000;
  local_2620._16_4_ = 0x80000000;
  local_2620._20_4_ = 0x80000000;
  local_2620._24_4_ = 0x80000000;
  local_2620._28_4_ = 0x80000000;
  local_26a0._0_8_ = CONCAT44(fVar58,fVar58) ^ 0x8000000080000000;
  local_26a0._8_4_ = -fVar58;
  local_26a0._12_4_ = -fVar58;
  local_26a0._16_4_ = -fVar58;
  local_26a0._20_4_ = -fVar58;
  local_26a0._24_4_ = -fVar58;
  local_26a0._28_4_ = -fVar58;
  auVar76 = ZEXT3264(local_26a0);
  local_26c0._0_8_ = CONCAT44(fVar59,fVar59) ^ 0x8000000080000000;
  local_26c0._8_4_ = -fVar59;
  local_26c0._12_4_ = -fVar59;
  local_26c0._16_4_ = -fVar59;
  local_26c0._20_4_ = -fVar59;
  local_26c0._24_4_ = -fVar59;
  local_26c0._28_4_ = -fVar59;
  auVar79 = ZEXT3264(local_26c0);
  local_26e0._0_8_ = CONCAT44(fVar60,fVar60) ^ 0x8000000080000000;
  local_26e0._8_4_ = -fVar60;
  local_26e0._12_4_ = -fVar60;
  local_26e0._16_4_ = -fVar60;
  local_26e0._20_4_ = -fVar60;
  local_26e0._24_4_ = -fVar60;
  local_26e0._28_4_ = -fVar60;
  auVar84 = ZEXT3264(local_26e0);
  iVar45 = (tray->tnear).field_0.i[k];
  local_2700._4_4_ = iVar45;
  local_2700._0_4_ = iVar45;
  local_2700._8_4_ = iVar45;
  local_2700._12_4_ = iVar45;
  local_2700._16_4_ = iVar45;
  local_2700._20_4_ = iVar45;
  local_2700._24_4_ = iVar45;
  local_2700._28_4_ = iVar45;
  auVar85 = ZEXT3264(local_2700);
  local_2720._16_16_ = mm_lookupmask_ps._240_16_;
  local_2720._0_16_ = mm_lookupmask_ps._0_16_;
  auVar55._8_4_ = 0x3f800000;
  auVar55._0_8_ = &DAT_3f8000003f800000;
  auVar55._12_4_ = 0x3f800000;
  auVar55._16_4_ = 0x3f800000;
  auVar55._20_4_ = 0x3f800000;
  auVar55._24_4_ = 0x3f800000;
  auVar55._28_4_ = 0x3f800000;
  auVar88._8_4_ = 0xbf800000;
  auVar88._0_8_ = 0xbf800000bf800000;
  auVar88._12_4_ = 0xbf800000;
  auVar88._16_4_ = 0xbf800000;
  auVar88._20_4_ = 0xbf800000;
  auVar88._24_4_ = 0xbf800000;
  auVar88._28_4_ = 0xbf800000;
  _local_2740 = vblendvps_avx(auVar55,auVar88,local_2720);
  do {
    do {
      do {
        if (pauVar41 == (undefined1 (*) [16])&local_23a0) {
          return;
        }
        pauVar40 = pauVar41 + -1;
        pauVar41 = pauVar41 + -1;
      } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar40 + 8));
      uVar36 = *(ulong *)*pauVar41;
      pauVar40 = pauVar41;
      do {
        auVar83 = auVar84._0_32_;
        auVar78 = auVar79._0_32_;
        auVar50 = auVar76._0_32_;
        auVar72 = auVar74._0_32_;
        auVar55 = auVar71._0_32_;
        auVar88 = auVar70._0_32_;
        if ((uVar36 & 8) == 0) {
          auVar46 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar37),auVar50,auVar88);
          auVar49 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar38),auVar78,auVar55);
          auVar10 = vpmaxsd_avx2(ZEXT1632(auVar46),ZEXT1632(auVar49));
          auVar46 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + uVar39),auVar83,auVar72);
          auVar11 = vpmaxsd_avx2(ZEXT1632(auVar46),auVar85._0_32_);
          local_2580 = vpmaxsd_avx2(auVar10,auVar11);
          auVar46 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar37 ^ 0x20)),auVar50,
                                    auVar88);
          auVar49 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar38 ^ 0x20)),auVar78,
                                    auVar55);
          auVar10 = vpminsd_avx2(ZEXT1632(auVar46),ZEXT1632(auVar49));
          auVar46 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar36 + 0x40 + (uVar39 ^ 0x20)),auVar83,
                                    auVar72);
          auVar11 = vpminsd_avx2(ZEXT1632(auVar46),auVar87._0_32_);
          auVar10 = vpminsd_avx2(auVar10,auVar11);
          auVar10 = vpcmpgtd_avx2(local_2580,auVar10);
          uVar28 = vmovmskps_avx(auVar10);
          unaff_R13 = (ulong)(byte)~(byte)uVar28;
        }
        pauVar41 = pauVar40;
        if ((uVar36 & 8) == 0) {
          if (unaff_R13 == 0) {
            iVar45 = 4;
          }
          else {
            uVar35 = uVar36 & 0xfffffffffffffff0;
            lVar42 = 0;
            for (uVar36 = unaff_R13; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
              lVar42 = lVar42 + 1;
            }
            iVar45 = 0;
            uVar31 = unaff_R13 - 1 & unaff_R13;
            uVar36 = *(ulong *)(uVar35 + lVar42 * 8);
            if (uVar31 != 0) {
              uVar53 = *(uint *)(local_2580 + lVar42 * 4);
              lVar42 = 0;
              for (uVar12 = uVar31; (uVar12 & 1) == 0; uVar12 = uVar12 >> 1 | 0x8000000000000000) {
                lVar42 = lVar42 + 1;
              }
              uVar31 = uVar31 - 1 & uVar31;
              uVar12 = *(ulong *)(uVar35 + lVar42 * 8);
              uVar29 = *(uint *)(local_2580 + lVar42 * 4);
              if (uVar31 == 0) {
                pauVar41 = pauVar40 + 1;
                if (uVar53 < uVar29) {
                  *(ulong *)*pauVar40 = uVar12;
                  *(uint *)(*pauVar40 + 8) = uVar29;
                }
                else {
                  *(ulong *)*pauVar40 = uVar36;
                  *(uint *)(*pauVar40 + 8) = uVar53;
                  uVar36 = uVar12;
                }
              }
              else {
                auVar46._8_8_ = 0;
                auVar46._0_8_ = uVar36;
                auVar46 = vpunpcklqdq_avx(auVar46,ZEXT416(uVar53));
                auVar49._8_8_ = 0;
                auVar49._0_8_ = uVar12;
                auVar49 = vpunpcklqdq_avx(auVar49,ZEXT416(uVar29));
                lVar42 = 0;
                for (uVar36 = uVar31; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000)
                {
                  lVar42 = lVar42 + 1;
                }
                uVar31 = uVar31 - 1 & uVar31;
                auVar54._8_8_ = 0;
                auVar54._0_8_ = *(ulong *)(uVar35 + lVar42 * 8);
                auVar47 = vpunpcklqdq_avx(auVar54,ZEXT416(*(uint *)(local_2580 + lVar42 * 4)));
                auVar54 = vpcmpgtd_avx(auVar49,auVar46);
                if (uVar31 == 0) {
                  auVar63 = vpshufd_avx(auVar54,0xaa);
                  auVar54 = vblendvps_avx(auVar49,auVar46,auVar63);
                  auVar46 = vblendvps_avx(auVar46,auVar49,auVar63);
                  auVar49 = vpcmpgtd_avx(auVar47,auVar54);
                  auVar63 = vpshufd_avx(auVar49,0xaa);
                  auVar49 = vblendvps_avx(auVar47,auVar54,auVar63);
                  auVar54 = vblendvps_avx(auVar54,auVar47,auVar63);
                  auVar47 = vpcmpgtd_avx(auVar54,auVar46);
                  auVar63 = vpshufd_avx(auVar47,0xaa);
                  auVar47 = vblendvps_avx(auVar54,auVar46,auVar63);
                  auVar46 = vblendvps_avx(auVar46,auVar54,auVar63);
                  *pauVar40 = auVar46;
                  pauVar40[1] = auVar47;
                  uVar36 = auVar49._0_8_;
                  pauVar41 = pauVar40 + 2;
                }
                else {
                  lVar42 = 0;
                  for (uVar36 = uVar31; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000
                      ) {
                    lVar42 = lVar42 + 1;
                  }
                  uVar31 = uVar31 - 1 & uVar31;
                  auVar63._8_8_ = 0;
                  auVar63._0_8_ = *(ulong *)(uVar35 + lVar42 * 8);
                  auVar63 = vpunpcklqdq_avx(auVar63,ZEXT416(*(uint *)(local_2580 + lVar42 * 4)));
                  if (uVar31 == 0) {
                    auVar13 = vpshufd_avx(auVar54,0xaa);
                    auVar54 = vblendvps_avx(auVar49,auVar46,auVar13);
                    auVar46 = vblendvps_avx(auVar46,auVar49,auVar13);
                    auVar49 = vpcmpgtd_avx(auVar63,auVar47);
                    auVar13 = vpshufd_avx(auVar49,0xaa);
                    auVar49 = vblendvps_avx(auVar63,auVar47,auVar13);
                    auVar47 = vblendvps_avx(auVar47,auVar63,auVar13);
                    auVar63 = vpcmpgtd_avx(auVar47,auVar46);
                    auVar13 = vpshufd_avx(auVar63,0xaa);
                    auVar63 = vblendvps_avx(auVar47,auVar46,auVar13);
                    auVar46 = vblendvps_avx(auVar46,auVar47,auVar13);
                    auVar47 = vpcmpgtd_avx(auVar49,auVar54);
                    auVar13 = vpshufd_avx(auVar47,0xaa);
                    auVar47 = vblendvps_avx(auVar49,auVar54,auVar13);
                    auVar49 = vblendvps_avx(auVar54,auVar49,auVar13);
                    auVar54 = vpcmpgtd_avx(auVar63,auVar49);
                    auVar13 = vpshufd_avx(auVar54,0xaa);
                    auVar54 = vblendvps_avx(auVar63,auVar49,auVar13);
                    auVar49 = vblendvps_avx(auVar49,auVar63,auVar13);
                    *pauVar40 = auVar46;
                    pauVar40[1] = auVar49;
                    pauVar40[2] = auVar54;
                    uVar36 = auVar47._0_8_;
                    pauVar41 = pauVar40 + 3;
                  }
                  else {
                    *pauVar40 = auVar46;
                    pauVar40[1] = auVar49;
                    pauVar40[2] = auVar47;
                    pauVar40[3] = auVar63;
                    lVar42 = 0x30;
                    do {
                      lVar43 = lVar42;
                      lVar42 = 0;
                      for (uVar36 = uVar31; (uVar36 & 1) == 0;
                          uVar36 = uVar36 >> 1 | 0x8000000000000000) {
                        lVar42 = lVar42 + 1;
                      }
                      auVar47._8_8_ = 0;
                      auVar47._0_8_ = *(ulong *)(uVar35 + lVar42 * 8);
                      auVar46 = vpunpcklqdq_avx(auVar47,ZEXT416(*(uint *)(local_2580 + lVar42 * 4)))
                      ;
                      *(undefined1 (*) [16])(pauVar40[1] + lVar43) = auVar46;
                      uVar31 = uVar31 - 1 & uVar31;
                      lVar42 = lVar43 + 0x10;
                    } while (uVar31 != 0);
                    pauVar41 = (undefined1 (*) [16])(pauVar40[1] + lVar43);
                    if (lVar43 + 0x10 != 0) {
                      lVar42 = 0x10;
                      pauVar32 = pauVar40;
                      do {
                        auVar46 = pauVar32[1];
                        uVar53 = *(uint *)(pauVar32[1] + 8);
                        pauVar32 = pauVar32 + 1;
                        lVar43 = lVar42;
                        do {
                          if (uVar53 <= *(uint *)(pauVar40[-1] + lVar43 + 8)) {
                            pauVar44 = (undefined1 (*) [16])(*pauVar40 + lVar43);
                            break;
                          }
                          *(undefined1 (*) [16])(*pauVar40 + lVar43) =
                               *(undefined1 (*) [16])(pauVar40[-1] + lVar43);
                          lVar43 = lVar43 + -0x10;
                          pauVar44 = pauVar40;
                        } while (lVar43 != 0);
                        *pauVar44 = auVar46;
                        lVar42 = lVar42 + 0x10;
                      } while (pauVar41 != pauVar32);
                    }
                    uVar36 = *(ulong *)*pauVar41;
                  }
                  auVar70 = ZEXT3264(auVar88);
                  auVar71 = ZEXT3264(auVar55);
                  auVar74 = ZEXT3264(auVar72);
                  auVar76 = ZEXT3264(auVar50);
                  auVar79 = ZEXT3264(auVar78);
                  auVar84 = ZEXT3264(auVar83);
                  auVar85 = ZEXT3264(auVar85._0_32_);
                  iVar45 = 0;
                }
              }
            }
          }
        }
        else {
          iVar45 = 6;
        }
        pauVar40 = pauVar41;
      } while (iVar45 == 0);
    } while (iVar45 != 6);
    uVar35 = (ulong)((uint)uVar36 & 0xf);
    if (uVar35 != 8) {
      uVar28 = *(undefined4 *)(ray + k * 4);
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x10);
      uVar2 = *(undefined4 *)(ray + k * 4 + 0x20);
      local_25c0 = *(float *)(ray + k * 4 + 0x40);
      fStack_25bc = local_25c0;
      fStack_25b8 = local_25c0;
      fStack_25b4 = local_25c0;
      fStack_25b0 = local_25c0;
      fStack_25ac = local_25c0;
      fStack_25a8 = local_25c0;
      fStack_25a4 = local_25c0;
      local_25e0 = *(float *)(ray + k * 4 + 0x50);
      fStack_25dc = local_25e0;
      fStack_25d8 = local_25e0;
      fStack_25d4 = local_25e0;
      fStack_25d0 = local_25e0;
      fStack_25cc = local_25e0;
      fStack_25c8 = local_25e0;
      fStack_25c4 = local_25e0;
      uVar36 = uVar36 & 0xfffffffffffffff0;
      local_2600 = *(float *)(ray + k * 4 + 0x60);
      fStack_25fc = local_2600;
      fStack_25f8 = local_2600;
      fStack_25f4 = local_2600;
      fStack_25f0 = local_2600;
      fStack_25ec = local_2600;
      fStack_25e8 = local_2600;
      fStack_25e4 = local_2600;
      lVar42 = 0;
      do {
        lVar33 = lVar42 * 0xe0;
        lVar43 = uVar36 + 0xd0 + lVar33;
        local_25a0 = *(undefined8 *)(lVar43 + 0x10);
        uStack_2598 = *(undefined8 *)(lVar43 + 0x18);
        lVar43 = uVar36 + 0xc0 + lVar33;
        local_2780 = *(undefined8 *)(lVar43 + 0x10);
        uStack_2778 = *(undefined8 *)(lVar43 + 0x18);
        uStack_2770 = local_2780;
        uStack_2768 = uStack_2778;
        uStack_2590 = local_25a0;
        uStack_2588 = uStack_2598;
        auVar48._16_16_ = *(undefined1 (*) [16])(uVar36 + 0x60 + lVar33);
        auVar48._0_16_ = *(undefined1 (*) [16])(uVar36 + lVar33);
        auVar46 = *(undefined1 (*) [16])(uVar36 + 0x70 + lVar33);
        auVar64._16_16_ = auVar46;
        auVar64._0_16_ = *(undefined1 (*) [16])(uVar36 + 0x10 + lVar33);
        auVar49 = *(undefined1 (*) [16])(uVar36 + 0x80 + lVar33);
        auVar67._16_16_ = auVar49;
        auVar67._0_16_ = *(undefined1 (*) [16])(uVar36 + 0x20 + lVar33);
        auVar54 = *(undefined1 (*) [16])(uVar36 + 0x30 + lVar33);
        auVar50._16_16_ = auVar54;
        auVar50._0_16_ = auVar54;
        auVar54 = *(undefined1 (*) [16])(uVar36 + 0x40 + lVar33);
        auVar56._16_16_ = auVar54;
        auVar56._0_16_ = auVar54;
        auVar54 = *(undefined1 (*) [16])(uVar36 + 0x50 + lVar33);
        auVar62._16_16_ = auVar54;
        auVar62._0_16_ = auVar54;
        auVar47 = *(undefined1 (*) [16])(uVar36 + 0x90 + lVar33);
        auVar73._16_16_ = auVar47;
        auVar73._0_16_ = auVar47;
        auVar47 = *(undefined1 (*) [16])(uVar36 + 0xa0 + lVar33);
        auVar75._16_16_ = auVar47;
        auVar75._0_16_ = auVar47;
        auVar63 = *(undefined1 (*) [16])(uVar36 + 0xb0 + lVar33);
        auVar86._16_16_ = auVar63;
        auVar86._0_16_ = auVar63;
        auVar55 = vsubps_avx(auVar48,auVar50);
        auVar88 = vsubps_avx(auVar64,auVar56);
        auVar72 = vsubps_avx(auVar67,auVar62);
        auVar50 = vsubps_avx(auVar73,auVar48);
        auVar78 = vsubps_avx(auVar75,auVar64);
        auVar83 = vsubps_avx(auVar86,auVar67);
        auVar10._4_4_ = auVar88._4_4_ * auVar83._4_4_;
        auVar10._0_4_ = auVar88._0_4_ * auVar83._0_4_;
        auVar10._8_4_ = auVar88._8_4_ * auVar83._8_4_;
        auVar10._12_4_ = auVar88._12_4_ * auVar83._12_4_;
        auVar10._16_4_ = auVar88._16_4_ * auVar83._16_4_;
        auVar10._20_4_ = auVar88._20_4_ * auVar83._20_4_;
        auVar10._24_4_ = auVar88._24_4_ * auVar83._24_4_;
        auVar10._28_4_ = auVar47._12_4_;
        auVar47 = vfmsub231ps_fma(auVar10,auVar78,auVar72);
        auVar11._4_4_ = auVar72._4_4_ * auVar50._4_4_;
        auVar11._0_4_ = auVar72._0_4_ * auVar50._0_4_;
        auVar11._8_4_ = auVar72._8_4_ * auVar50._8_4_;
        auVar11._12_4_ = auVar72._12_4_ * auVar50._12_4_;
        auVar11._16_4_ = auVar72._16_4_ * auVar50._16_4_;
        auVar11._20_4_ = auVar72._20_4_ * auVar50._20_4_;
        auVar11._24_4_ = auVar72._24_4_ * auVar50._24_4_;
        auVar11._28_4_ = auVar54._12_4_;
        auVar63 = vfmsub231ps_fma(auVar11,auVar83,auVar55);
        auVar9._4_4_ = uVar28;
        auVar9._0_4_ = uVar28;
        auVar9._8_4_ = uVar28;
        auVar9._12_4_ = uVar28;
        auVar9._16_4_ = uVar28;
        auVar9._20_4_ = uVar28;
        auVar9._24_4_ = uVar28;
        auVar9._28_4_ = uVar28;
        auVar10 = vsubps_avx(auVar48,auVar9);
        auVar23._4_4_ = uVar1;
        auVar23._0_4_ = uVar1;
        auVar23._8_4_ = uVar1;
        auVar23._12_4_ = uVar1;
        auVar23._16_4_ = uVar1;
        auVar23._20_4_ = uVar1;
        auVar23._24_4_ = uVar1;
        auVar23._28_4_ = uVar1;
        auVar11 = vsubps_avx(auVar64,auVar23);
        auVar24._4_4_ = uVar2;
        auVar24._0_4_ = uVar2;
        auVar24._8_4_ = uVar2;
        auVar24._12_4_ = uVar2;
        auVar24._16_4_ = uVar2;
        auVar24._20_4_ = uVar2;
        auVar24._24_4_ = uVar2;
        auVar24._28_4_ = uVar2;
        auVar9 = vsubps_avx(auVar67,auVar24);
        auVar27._4_4_ = fStack_25bc;
        auVar27._0_4_ = local_25c0;
        auVar27._8_4_ = fStack_25b8;
        auVar27._12_4_ = fStack_25b4;
        auVar27._16_4_ = fStack_25b0;
        auVar27._20_4_ = fStack_25ac;
        auVar27._24_4_ = fStack_25a8;
        auVar27._28_4_ = fStack_25a4;
        auVar15._4_4_ = fStack_25bc * auVar11._4_4_;
        auVar15._0_4_ = local_25c0 * auVar11._0_4_;
        auVar15._8_4_ = fStack_25b8 * auVar11._8_4_;
        auVar15._12_4_ = fStack_25b4 * auVar11._12_4_;
        auVar15._16_4_ = fStack_25b0 * auVar11._16_4_;
        auVar15._20_4_ = fStack_25ac * auVar11._20_4_;
        auVar15._24_4_ = fStack_25a8 * auVar11._24_4_;
        auVar15._28_4_ = auVar46._12_4_;
        auVar26._4_4_ = fStack_25dc;
        auVar26._0_4_ = local_25e0;
        auVar26._8_4_ = fStack_25d8;
        auVar26._12_4_ = fStack_25d4;
        auVar26._16_4_ = fStack_25d0;
        auVar26._20_4_ = fStack_25cc;
        auVar26._24_4_ = fStack_25c8;
        auVar26._28_4_ = fStack_25c4;
        auVar46 = vfmsub231ps_fma(auVar15,auVar10,auVar26);
        auVar16._4_4_ = auVar83._4_4_ * auVar46._4_4_;
        auVar16._0_4_ = auVar83._0_4_ * auVar46._0_4_;
        auVar16._8_4_ = auVar83._8_4_ * auVar46._8_4_;
        auVar16._12_4_ = auVar83._12_4_ * auVar46._12_4_;
        auVar16._16_4_ = auVar83._16_4_ * 0.0;
        auVar16._20_4_ = auVar83._20_4_ * 0.0;
        auVar16._24_4_ = auVar83._24_4_ * 0.0;
        auVar16._28_4_ = auVar49._12_4_;
        auVar65._0_4_ = auVar72._0_4_ * auVar46._0_4_;
        auVar65._4_4_ = auVar72._4_4_ * auVar46._4_4_;
        auVar65._8_4_ = auVar72._8_4_ * auVar46._8_4_;
        auVar65._12_4_ = auVar72._12_4_ * auVar46._12_4_;
        auVar65._16_4_ = auVar72._16_4_ * 0.0;
        auVar65._20_4_ = auVar72._20_4_ * 0.0;
        auVar65._24_4_ = auVar72._24_4_ * 0.0;
        auVar65._28_4_ = 0;
        auVar25._4_4_ = fStack_25fc;
        auVar25._0_4_ = local_2600;
        auVar25._8_4_ = fStack_25f8;
        auVar25._12_4_ = fStack_25f4;
        auVar25._16_4_ = fStack_25f0;
        auVar25._20_4_ = fStack_25ec;
        auVar25._24_4_ = fStack_25e8;
        auVar25._28_4_ = fStack_25e4;
        auVar17._4_4_ = fStack_25fc * auVar10._4_4_;
        auVar17._0_4_ = local_2600 * auVar10._0_4_;
        auVar17._8_4_ = fStack_25f8 * auVar10._8_4_;
        auVar17._12_4_ = fStack_25f4 * auVar10._12_4_;
        auVar17._16_4_ = fStack_25f0 * auVar10._16_4_;
        auVar17._20_4_ = fStack_25ec * auVar10._20_4_;
        auVar17._24_4_ = fStack_25e8 * auVar10._24_4_;
        auVar17._28_4_ = auVar72._28_4_;
        auVar49 = vfmsub231ps_fma(auVar17,auVar9,auVar27);
        auVar46 = vfmadd231ps_fma(auVar16,ZEXT1632(auVar49),auVar78);
        auVar72._4_4_ = auVar78._4_4_ * auVar55._4_4_;
        auVar72._0_4_ = auVar78._0_4_ * auVar55._0_4_;
        auVar72._8_4_ = auVar78._8_4_ * auVar55._8_4_;
        auVar72._12_4_ = auVar78._12_4_ * auVar55._12_4_;
        auVar72._16_4_ = auVar78._16_4_ * auVar55._16_4_;
        auVar72._20_4_ = auVar78._20_4_ * auVar55._20_4_;
        auVar72._24_4_ = auVar78._24_4_ * auVar55._24_4_;
        auVar72._28_4_ = auVar78._28_4_;
        auVar13 = vfmsub231ps_fma(auVar72,auVar50,auVar88);
        auVar49 = vfmadd231ps_fma(auVar65,auVar88,ZEXT1632(auVar49));
        auVar78._4_4_ = fStack_25dc * auVar9._4_4_;
        auVar78._0_4_ = local_25e0 * auVar9._0_4_;
        auVar78._8_4_ = fStack_25d8 * auVar9._8_4_;
        auVar78._12_4_ = fStack_25d4 * auVar9._12_4_;
        auVar78._16_4_ = fStack_25d0 * auVar9._16_4_;
        auVar78._20_4_ = fStack_25cc * auVar9._20_4_;
        auVar78._24_4_ = fStack_25c8 * auVar9._24_4_;
        auVar78._28_4_ = auVar83._28_4_;
        auVar14 = vfmsub231ps_fma(auVar78,auVar11,auVar25);
        fVar77 = auVar13._0_4_;
        fVar80 = auVar13._4_4_;
        auVar83._4_4_ = fVar80 * fStack_25fc;
        auVar83._0_4_ = fVar77 * local_2600;
        fVar81 = auVar13._8_4_;
        auVar83._8_4_ = fVar81 * fStack_25f8;
        fVar82 = auVar13._12_4_;
        auVar83._12_4_ = fVar82 * fStack_25f4;
        auVar83._16_4_ = fStack_25f0 * 0.0;
        auVar83._20_4_ = fStack_25ec * 0.0;
        auVar83._24_4_ = fStack_25e8 * 0.0;
        auVar83._28_4_ = fStack_25e4;
        auVar54 = vfmadd231ps_fma(auVar83,ZEXT1632(auVar63),auVar26);
        auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),ZEXT1632(auVar47),auVar27);
        auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),ZEXT1632(auVar14),auVar50);
        auVar88 = vandps_avx(ZEXT1632(auVar54),local_2620);
        uVar53 = auVar88._0_4_;
        local_2580._0_4_ = (float)(uVar53 ^ auVar46._0_4_);
        uVar29 = auVar88._4_4_;
        local_2580._4_4_ = (float)(uVar29 ^ auVar46._4_4_);
        uVar30 = auVar88._8_4_;
        local_2580._8_4_ = (float)(uVar30 ^ auVar46._8_4_);
        uVar57 = auVar88._12_4_;
        local_2580._12_4_ = (float)(uVar57 ^ auVar46._12_4_);
        fVar58 = auVar88._16_4_;
        local_2580._16_4_ = fVar58;
        fVar59 = auVar88._20_4_;
        local_2580._20_4_ = fVar59;
        fVar60 = auVar88._24_4_;
        local_2580._24_4_ = fVar60;
        fVar61 = auVar88._28_4_;
        local_2580._28_4_ = fVar61;
        auVar46 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar55,ZEXT1632(auVar14));
        local_2560._0_4_ = (float)(uVar53 ^ auVar46._0_4_);
        local_2560._4_4_ = (float)(uVar29 ^ auVar46._4_4_);
        local_2560._8_4_ = (float)(uVar30 ^ auVar46._8_4_);
        local_2560._12_4_ = (float)(uVar57 ^ auVar46._12_4_);
        local_2560._16_4_ = fVar58;
        local_2560._20_4_ = fVar59;
        local_2560._24_4_ = fVar60;
        local_2560._28_4_ = fVar61;
        auVar88 = vcmpps_avx(local_2580,ZEXT832(0) << 0x20,5);
        auVar55 = vcmpps_avx(local_2560,ZEXT832(0) << 0x20,5);
        auVar88 = vandps_avx(auVar88,auVar55);
        auVar51._8_4_ = 0x7fffffff;
        auVar51._0_8_ = 0x7fffffff7fffffff;
        auVar51._12_4_ = 0x7fffffff;
        auVar51._16_4_ = 0x7fffffff;
        auVar51._20_4_ = 0x7fffffff;
        auVar51._24_4_ = 0x7fffffff;
        auVar51._28_4_ = 0x7fffffff;
        local_2520 = vandps_avx(ZEXT1632(auVar54),auVar51);
        auVar55 = vcmpps_avx(ZEXT1632(auVar54),ZEXT832(0) << 0x20,4);
        auVar88 = vandps_avx(auVar88,auVar55);
        auVar68._0_4_ = local_2560._0_4_ + local_2580._0_4_;
        auVar68._4_4_ = local_2560._4_4_ + local_2580._4_4_;
        auVar68._8_4_ = local_2560._8_4_ + local_2580._8_4_;
        auVar68._12_4_ = local_2560._12_4_ + local_2580._12_4_;
        auVar68._16_4_ = fVar58 + fVar58;
        auVar68._20_4_ = fVar59 + fVar59;
        auVar68._24_4_ = fVar60 + fVar60;
        auVar68._28_4_ = fVar61 + fVar61;
        auVar55 = vcmpps_avx(auVar68,local_2520,2);
        auVar72 = auVar55 & auVar88;
        if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar72 >> 0x7f,0) != '\0') ||
              (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar72 >> 0xbf,0) != '\0') ||
            (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar72[0x1f] < '\0') {
          auVar88 = vandps_avx(auVar88,auVar55);
          auVar46 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
          auVar18._4_4_ = fVar80 * auVar9._4_4_;
          auVar18._0_4_ = fVar77 * auVar9._0_4_;
          auVar18._8_4_ = fVar81 * auVar9._8_4_;
          auVar18._12_4_ = fVar82 * auVar9._12_4_;
          auVar18._16_4_ = auVar9._16_4_ * 0.0;
          auVar18._20_4_ = auVar9._20_4_ * 0.0;
          auVar18._24_4_ = auVar9._24_4_ * 0.0;
          auVar18._28_4_ = auVar9._28_4_;
          auVar49 = vfmadd213ps_fma(auVar11,ZEXT1632(auVar63),auVar18);
          auVar49 = vfmadd213ps_fma(auVar10,ZEXT1632(auVar47),ZEXT1632(auVar49));
          local_2540._0_4_ = (float)(auVar49._0_4_ ^ uVar53);
          local_2540._4_4_ = (float)(auVar49._4_4_ ^ uVar29);
          local_2540._8_4_ = (float)(auVar49._8_4_ ^ uVar30);
          local_2540._12_4_ = (float)(auVar49._12_4_ ^ uVar57);
          local_2540._16_4_ = fVar58;
          local_2540._20_4_ = fVar59;
          local_2540._24_4_ = fVar60;
          local_2540._28_4_ = fVar61;
          fVar61 = *(float *)(ray + k * 4 + 0x30);
          auVar19._4_4_ = local_2520._4_4_ * fVar61;
          auVar19._0_4_ = local_2520._0_4_ * fVar61;
          auVar19._8_4_ = local_2520._8_4_ * fVar61;
          auVar19._12_4_ = local_2520._12_4_ * fVar61;
          auVar19._16_4_ = local_2520._16_4_ * fVar61;
          auVar19._20_4_ = local_2520._20_4_ * fVar61;
          auVar19._24_4_ = local_2520._24_4_ * fVar61;
          auVar19._28_4_ = fVar61;
          auVar88 = vcmpps_avx(auVar19,local_2540,1);
          fVar61 = *(float *)(ray + k * 4 + 0x80);
          auVar20._4_4_ = local_2520._4_4_ * fVar61;
          auVar20._0_4_ = local_2520._0_4_ * fVar61;
          auVar20._8_4_ = local_2520._8_4_ * fVar61;
          auVar20._12_4_ = local_2520._12_4_ * fVar61;
          auVar20._16_4_ = local_2520._16_4_ * fVar61;
          auVar20._20_4_ = local_2520._20_4_ * fVar61;
          auVar20._24_4_ = local_2520._24_4_ * fVar61;
          auVar20._28_4_ = fVar61;
          auVar55 = vcmpps_avx(local_2540,auVar20,2);
          auVar88 = vandps_avx(auVar88,auVar55);
          auVar49 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
          auVar46 = vpand_avx(auVar49,auVar46);
          auVar88 = vpmovzxwd_avx2(auVar46);
          auVar88 = vpslld_avx2(auVar88,0x1f);
          if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar88 >> 0x7f,0) != '\0') ||
                (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar88 >> 0xbf,0) != '\0') ||
              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar88[0x1f] < '\0') {
            local_24a0 = vpsrad_avx2(auVar88,0x1f);
            local_2500 = ZEXT1632(auVar47);
            local_24e0 = ZEXT1632(auVar63);
            local_24c0 = ZEXT1632(auVar13);
            local_23c0 = local_2720;
            local_2760 = local_24a0;
            auVar55 = vrcpps_avx(local_2520);
            auVar69._8_4_ = 0x3f800000;
            auVar69._0_8_ = &DAT_3f8000003f800000;
            auVar69._12_4_ = 0x3f800000;
            auVar69._16_4_ = 0x3f800000;
            auVar69._20_4_ = 0x3f800000;
            auVar69._24_4_ = 0x3f800000;
            auVar69._28_4_ = 0x3f800000;
            auVar49 = vfnmadd213ps_fma(local_2520,auVar55,auVar69);
            auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar55,auVar55);
            fVar61 = auVar49._0_4_;
            fVar6 = auVar49._4_4_;
            auVar21._4_4_ = local_2540._4_4_ * fVar6;
            auVar21._0_4_ = local_2540._0_4_ * fVar61;
            fVar7 = auVar49._8_4_;
            auVar21._8_4_ = local_2540._8_4_ * fVar7;
            fVar8 = auVar49._12_4_;
            auVar21._12_4_ = local_2540._12_4_ * fVar8;
            auVar21._16_4_ = fVar58 * 0.0;
            auVar21._20_4_ = fVar59 * 0.0;
            auVar21._24_4_ = fVar60 * 0.0;
            auVar21._28_4_ = fStack_25a4;
            local_2440 = auVar21;
            auVar22._4_4_ = fVar6 * local_2580._4_4_;
            auVar22._0_4_ = fVar61 * local_2580._0_4_;
            auVar22._8_4_ = fVar7 * local_2580._8_4_;
            auVar22._12_4_ = fVar8 * local_2580._12_4_;
            auVar22._16_4_ = fVar58 * 0.0;
            auVar22._20_4_ = fVar59 * 0.0;
            auVar22._24_4_ = fVar60 * 0.0;
            auVar22._28_4_ = auVar55._28_4_;
            auVar55 = vminps_avx(auVar22,auVar69);
            auVar52._0_4_ = local_2560._0_4_ * fVar61;
            auVar52._4_4_ = local_2560._4_4_ * fVar6;
            auVar52._8_4_ = local_2560._8_4_ * fVar7;
            auVar52._12_4_ = local_2560._12_4_ * fVar8;
            auVar52._16_4_ = fVar58 * 0.0;
            auVar52._20_4_ = fVar59 * 0.0;
            auVar52._24_4_ = fVar60 * 0.0;
            auVar52._28_4_ = 0;
            auVar72 = vminps_avx(auVar52,auVar69);
            auVar50 = vsubps_avx(auVar69,auVar55);
            auVar78 = vsubps_avx(auVar69,auVar72);
            local_2460 = vblendvps_avx(auVar72,auVar50,local_2720);
            local_2480 = vblendvps_avx(auVar55,auVar78,local_2720);
            local_23e0._0_4_ = fVar77 * (float)local_2740._0_4_;
            local_23e0._4_4_ = fVar80 * (float)local_2740._4_4_;
            local_23e0._8_4_ = fVar81 * fStack_2738;
            local_23e0._12_4_ = fVar82 * fStack_2734;
            local_23e0._16_4_ = fStack_2730 * 0.0;
            local_23e0._20_4_ = fStack_272c * 0.0;
            local_23e0._24_4_ = fStack_2728 * 0.0;
            local_23e0._28_4_ = 0;
            local_2420[0] = auVar47._0_4_ * (float)local_2740._0_4_;
            local_2420[1] = auVar47._4_4_ * (float)local_2740._4_4_;
            local_2420[2] = auVar47._8_4_ * fStack_2738;
            local_2420[3] = auVar47._12_4_ * fStack_2734;
            fStack_2410 = fStack_2730 * 0.0;
            fStack_240c = fStack_272c * 0.0;
            fStack_2408 = fStack_2728 * 0.0;
            uStack_2404 = local_2480._28_4_;
            local_2400[0] = (float)local_2740._0_4_ * auVar63._0_4_;
            local_2400[1] = (float)local_2740._4_4_ * auVar63._4_4_;
            local_2400[2] = fStack_2738 * auVar63._8_4_;
            local_2400[3] = fStack_2734 * auVar63._12_4_;
            fStack_23f0 = fStack_2730 * 0.0;
            fStack_23ec = fStack_272c * 0.0;
            fStack_23e8 = fStack_2728 * 0.0;
            uStack_23e4 = auVar55._28_4_;
            auVar66._8_4_ = 0x7f800000;
            auVar66._0_8_ = 0x7f8000007f800000;
            auVar66._12_4_ = 0x7f800000;
            auVar66._16_4_ = 0x7f800000;
            auVar66._20_4_ = 0x7f800000;
            auVar66._24_4_ = 0x7f800000;
            auVar66._28_4_ = 0x7f800000;
            auVar88 = vblendvps_avx(auVar66,auVar21,auVar88);
            auVar55 = vshufps_avx(auVar88,auVar88,0xb1);
            auVar55 = vminps_avx(auVar88,auVar55);
            auVar72 = vshufpd_avx(auVar55,auVar55,5);
            auVar55 = vminps_avx(auVar55,auVar72);
            auVar72 = vpermpd_avx2(auVar55,0x4e);
            auVar55 = vminps_avx(auVar55,auVar72);
            auVar88 = vcmpps_avx(auVar88,auVar55,0);
            auVar49 = vpackssdw_avx(auVar88._0_16_,auVar88._16_16_);
            auVar46 = vpand_avx(auVar49,auVar46);
            auVar88 = vpmovzxwd_avx2(auVar46);
            auVar88 = vpslld_avx2(auVar88,0x1f);
            if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar88 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar88 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar88 >> 0x7f,0) == '\0') &&
                  (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar88 >> 0xbf,0) == '\0') &&
                (auVar88 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar88[0x1f]) {
              auVar88 = local_24a0;
            }
            uVar29 = vmovmskps_avx(auVar88);
            uVar53 = 0;
            for (; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x80000000) {
              uVar53 = uVar53 + 1;
            }
            local_27f8 = (ulong)uVar53;
            pRVar5 = (context->scene->geometries).items;
            uVar53 = *(uint *)(ray + k * 4 + 0x90);
            local_27f0 = (ulong)*(uint *)((long)&local_2780 + local_27f8 * 4);
            pGVar34 = pRVar5[local_27f0].ptr;
            while ((pGVar34->mask & uVar53) == 0) {
              *(undefined4 *)(local_2760 + local_27f8 * 4) = 0;
              if ((((((((local_2760 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_2760 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_2760 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_2760 >> 0x7f,0) == '\0') &&
                    (local_2760 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_2760 >> 0xbf,0) == '\0') &&
                  (local_2760 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_2760[0x1f]) goto LAB_0065d101;
              auVar88 = vblendvps_avx(auVar66,auVar21,local_2760);
              auVar55 = vshufps_avx(auVar88,auVar88,0xb1);
              auVar55 = vminps_avx(auVar88,auVar55);
              auVar72 = vshufpd_avx(auVar55,auVar55,5);
              auVar55 = vminps_avx(auVar55,auVar72);
              auVar72 = vpermpd_avx2(auVar55,0x4e);
              auVar55 = vminps_avx(auVar55,auVar72);
              auVar55 = vcmpps_avx(auVar88,auVar55,0);
              auVar72 = local_2760 & auVar55;
              auVar88 = local_2760;
              if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar72 >> 0x7f,0) != '\0') ||
                    (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar72 >> 0xbf,0) != '\0') ||
                  (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar72[0x1f] < '\0') {
                auVar88 = vandps_avx(auVar55,local_2760);
              }
              uVar30 = vmovmskps_avx(auVar88);
              uVar29 = 0;
              for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x80000000) {
                uVar29 = uVar29 + 1;
              }
              local_27f8 = (ulong)uVar29;
              local_27f0 = (ulong)*(uint *)((long)&local_2780 + local_27f8 * 4);
              pGVar34 = pRVar5[local_27f0].ptr;
            }
            uVar31 = (ulong)(uint)((int)local_27f8 << 2);
            uVar3 = *(undefined4 *)(local_2480 + uVar31);
            uVar4 = *(undefined4 *)(local_2460 + uVar31);
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_2440 + uVar31);
            *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)((long)local_2420 + uVar31);
            *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)((long)local_2400 + uVar31);
            *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_23e0 + uVar31);
            *(undefined4 *)(ray + k * 4 + 0xf0) = uVar3;
            *(undefined4 *)(ray + k * 4 + 0x100) = uVar4;
            *(undefined4 *)(ray + k * 4 + 0x110) = *(undefined4 *)((long)&local_25a0 + uVar31);
            *(int *)(ray + k * 4 + 0x120) = (int)local_27f0;
            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
          }
        }
LAB_0065d101:
        lVar42 = lVar42 + 1;
      } while (lVar42 != uVar35 - 8);
    }
    uVar28 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar87 = ZEXT3264(CONCAT428(uVar28,CONCAT424(uVar28,CONCAT420(uVar28,CONCAT416(uVar28,CONCAT412
                                                  (uVar28,CONCAT48(uVar28,CONCAT44(uVar28,uVar28))))
                                                  ))));
    auVar70 = ZEXT3264(local_2640);
    auVar71 = ZEXT3264(local_2660);
    auVar74 = ZEXT3264(local_2680);
    auVar76 = ZEXT3264(local_26a0);
    auVar79 = ZEXT3264(local_26c0);
    auVar84 = ZEXT3264(local_26e0);
    auVar85 = ZEXT3264(local_2700);
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }